

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsBool helicsFederateIsProtected(char *fedName,HelicsError *err)

{
  string_view fedName_00;
  FedObject *pFVar1;
  element_type *__str;
  int *in_RSI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  MasterObjectHolder *in_stack_00000008;
  string_view in_stack_00000010;
  FedObject *fed;
  char *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  HelicsBool HVar2;
  
  getMasterHolder();
  std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bb230);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pFVar1 = MasterObjectHolder::findFed(in_stack_00000008,in_stack_00000010,unaff_retaddr_00);
  std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1bb271);
  if (pFVar1 == (FedObject *)0x0) {
    getMasterHolder();
    __str = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1bb2cf);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff70,(char *)__str);
    fedName_00._M_len._4_4_ = unaff_retaddr_00;
    fedName_00._M_len._0_4_ = unaff_retaddr;
    fedName_00._M_str = (char *)in_stack_00000008;
    pFVar1 = MasterObjectHolder::findFed
                       ((MasterObjectHolder *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),fedName_00);
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1bb31d);
    if (((pFVar1 == (FedObject *)0x0) && (in_RSI != (int *)0x0)) && (*in_RSI == 0)) {
      *in_RSI = -3;
      *(char **)(in_RSI + 2) = "Federate was not found";
    }
    HVar2 = 0;
  }
  else {
    HVar2 = 1;
  }
  return HVar2;
}

Assistant:

HelicsBool helicsFederateIsProtected(const char* fedName, HelicsError* err)
{
    auto* fed = getMasterHolder()->findFed(fedName, fedPreservationIdentifier);
    if (fed != nullptr) {
        return HELICS_TRUE;
    }
    if (!(getMasterHolder()->findFed(fedName) != nullptr)) {
        if (err != nullptr) {
            if (err->error_code == 0) {
                err->error_code = HELICS_ERROR_INVALID_OBJECT;
                err->message = unrecognizedFederate;
            }
        }
    }
    return HELICS_FALSE;
}